

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partial_block_manager.cpp
# Opt level: O1

void __thiscall duckdb::PartialBlock::FlushInternal(PartialBlock *this,idx_t free_space_left)

{
  BufferManager *pBVar1;
  pointer pUVar2;
  data_ptr_t pdVar3;
  BlockManager *pBVar4;
  idx_t iVar5;
  idx_t iVar6;
  UninitializedRegion *uninitialized;
  pointer pUVar7;
  BufferHandle buffer_handle;
  BufferHandle local_40;
  
  if ((free_space_left != 0) ||
     ((this->uninitialized_regions).
      super_vector<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_>.
      super__Vector_base<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->uninitialized_regions).
      super_vector<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_>.
      super__Vector_base<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_>.
      _M_impl.super__Vector_impl_data._M_finish)) {
    pBVar1 = this->block_manager->buffer_manager;
    (*pBVar1->_vptr_BufferManager[7])(&local_40,pBVar1,&this->block_handle);
    pUVar7 = (this->uninitialized_regions).
             super_vector<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_>
             .
             super__Vector_base<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pUVar2 = (this->uninitialized_regions).
             super_vector<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_>
             .
             super__Vector_base<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pUVar7 != pUVar2) {
      do {
        optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_40.node);
        switchD_01306cb1::default
                  ((local_40.node.ptr)->buffer + pUVar7->start,0,pUVar7->end - pUVar7->start);
        pUVar7 = pUVar7 + 1;
      } while (pUVar7 != pUVar2);
    }
    optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_40.node);
    pdVar3 = (local_40.node.ptr)->buffer;
    pBVar4 = this->block_manager;
    iVar5 = optional_idx::GetIndex(&pBVar4->block_alloc_size);
    iVar6 = optional_idx::GetIndex(&pBVar4->block_header_size);
    switchD_01306cb1::default(pdVar3 + ((iVar5 - iVar6) - free_space_left),0,free_space_left);
    BufferHandle::~BufferHandle(&local_40);
  }
  return;
}

Assistant:

void PartialBlock::FlushInternal(const idx_t free_space_left) {

	// ensure that we do not leak any data
	if (free_space_left > 0 || !uninitialized_regions.empty()) {
		auto buffer_handle = block_manager.buffer_manager.Pin(block_handle);

		// memset any uninitialized regions
		for (auto &uninitialized : uninitialized_regions) {
			memset(buffer_handle.Ptr() + uninitialized.start, 0, uninitialized.end - uninitialized.start);
		}
		// memset any free space at the end of the block to 0 prior to writing to disk
		memset(buffer_handle.Ptr() + block_manager.GetBlockSize() - free_space_left, 0, free_space_left);
	}
}